

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.tab.cpp
# Opt level: O3

void yy_stack_print(yy_state_t *yybottom,yy_state_t *yytop)

{
  fwrite("Stack now",9,1,_stderr);
  if (yybottom <= yytop) {
    do {
      fprintf(_stderr," %d",(ulong)*yybottom);
      yybottom = yybottom + 1;
    } while (yybottom <= yytop);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

static void
yy_stack_print (yy_state_t *yybottom, yy_state_t *yytop)
{
  YYFPRINTF (stderr, "Stack now");
  for (; yybottom <= yytop; yybottom++)
    {
      int yybot = *yybottom;
      YYFPRINTF (stderr, " %d", yybot);
    }
  YYFPRINTF (stderr, "\n");
}